

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O0

void Abc_NtkQbf(Abc_Ntk_t *pNtk,int nPars,int nItersMax,int fDumpCnf,int fVerbose)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p;
  Vec_Int_t *pVVar6;
  Aig_Obj_t *pObj_00;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  char *pFileName_00;
  time_t tVar7;
  abctime aVar8;
  abctime aVar9;
  Abc_Ntk_t *pAVar10;
  Abc_Obj_t *pObj_01;
  Abc_Ntk_t *pNtk_00;
  int local_b4;
  int nZeros;
  int i_1;
  int Entry;
  int i;
  char *pFileName;
  Aig_Obj_t *pObj;
  Vec_Int_t *vExists;
  Vec_Int_t *vForAlls;
  Vec_Int_t *vVarMap;
  Cnf_Dat_t *pCnf;
  Aig_Man_t *pMan;
  int fFound;
  int RetValue;
  int nInputs;
  int nIters;
  abctime clkV;
  abctime clkS;
  abctime clkTotal;
  Vec_Int_t *vPiValues;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtkSyn2;
  Abc_Ntk_t *pNtkSyn;
  Abc_Ntk_t *pNtkVer;
  int fVerbose_local;
  int fDumpCnf_local;
  int nItersMax_local;
  int nPars_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar5 = Abc_Clock();
  bVar2 = false;
  iVar3 = Abc_NtkIsStrash(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                  ,0x4a,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar3 = Abc_NtkIsComb(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsComb(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                  ,0x4b,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar3 = Abc_NtkPoNum(pNtk);
  if (iVar3 != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                  ,0x4c,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if ((nPars < 1) || (iVar3 = Abc_NtkPiNum(pNtk), iVar3 <= nPars)) {
    __assert_fail("nPars > 0 && nPars < Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcQbf.c"
                  ,0x4d,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  Abc_NtkPiNum(pNtk);
  if (fDumpCnf == 0) {
    iVar3 = Abc_NtkPiNum(pNtk);
    pVVar6 = Vec_IntStart(iVar3);
    tVar7 = time((time_t *)0x0);
    srand((uint)tVar7);
    for (local_b4 = nPars; iVar3 = Abc_NtkPiNum(pNtk), local_b4 < iVar3; local_b4 = local_b4 + 1) {
      uVar4 = rand();
      Vec_IntWriteEntry(pVVar6,local_b4,uVar4 & 1);
    }
    Abc_NtkVectorClearPars(pVVar6,nPars);
    pNtkSyn2 = Abc_NtkMiterCofactor(pNtk,pVVar6);
    if (fVerbose != 0) {
      printf("Iter %2d : ",0);
      uVar4 = Abc_NtkNodeNum(pNtkSyn2);
      printf("AIG = %6d  ",(ulong)uVar4);
      Abc_NtkVectorPrintVars(pNtk,pVVar6,nPars);
      printf("\n");
    }
    for (RetValue = 0; RetValue < nItersMax; RetValue = RetValue + 1) {
      aVar8 = Abc_Clock();
      iVar3 = Abc_NtkDSat(pNtkSyn2,0,0,0,0,0,1,0,0,0);
      aVar9 = Abc_Clock();
      if (iVar3 == 0) {
        Abc_NtkModelToVector(pNtkSyn2,pVVar6);
      }
      if (iVar3 == 1) break;
      if (iVar3 == -1) {
        printf("Synthesis timed out.\n");
        break;
      }
      Abc_NtkVectorClearVars(pNtk,pVVar6,nPars);
      pAVar10 = Abc_NtkMiterCofactor(pNtk,pVVar6);
      pObj_01 = Abc_NtkPo(pAVar10,0);
      Abc_ObjXorFaninC(pObj_01,0);
      Abc_Clock();
      iVar3 = Abc_NtkMiterSat(pAVar10,0,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
      Abc_Clock();
      if (iVar3 == 0) {
        Abc_NtkModelToVector(pAVar10,pVVar6);
      }
      Abc_NtkDelete(pAVar10);
      if (iVar3 == 1) {
        bVar2 = true;
        break;
      }
      if (iVar3 == -1) {
        printf("Verification timed out.\n");
        break;
      }
      Abc_NtkVectorClearPars(pVVar6,nPars);
      pAVar10 = Abc_NtkMiterCofactor(pNtk,pVVar6);
      pNtk_00 = Abc_NtkMiterAnd(pNtkSyn2,pAVar10,0,0);
      Abc_NtkDelete(pAVar10);
      Abc_NtkDelete(pNtkSyn2);
      if (fVerbose != 0) {
        printf("Iter %2d : ",(ulong)(RetValue + 1));
        uVar4 = Abc_NtkNodeNum(pNtk_00);
        printf("AIG = %6d  ",(ulong)uVar4);
        Abc_NtkVectorPrintVars(pNtk,pVVar6,nPars);
        printf("  ");
        Abc_Print(1,"%s =","Syn");
        Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - aVar8) * 1.0) / 1000000.0);
      }
      pNtkSyn2 = pNtk_00;
      if (RetValue + 1 == nItersMax) break;
    }
    Abc_NtkDelete(pNtkSyn2);
    if (bVar2) {
      uVar4 = Vec_IntCountZero(pVVar6);
      printf("Parameters: ");
      Abc_NtkVectorPrintPars(pVVar6,nPars);
      iVar3 = Vec_IntSize(pVVar6);
      printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar4,(ulong)(iVar3 - uVar4));
      printf("Solved after %d interations.  ",(ulong)(uint)RetValue);
    }
    else if (RetValue == nItersMax) {
      printf("Unsolved after %d interations.  ",(ulong)(uint)RetValue);
    }
    else if (RetValue == nItersMax) {
      printf("Quit after %d interatios.  ",(ulong)(uint)nItersMax);
    }
    else {
      printf("Implementation does not exist.  ");
    }
    Abc_Print(1,"%s =","Total runtime");
    aVar8 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar5) * 1.0) / 1000000.0);
    Vec_IntFree(pVVar6);
  }
  else {
    pAig = Abc_NtkToDar(pNtk,0,0);
    p = Cnf_Derive(pAig,0);
    pVVar6 = Vec_IntStart(p->nVars);
    for (i_1 = 0; iVar3 = Vec_PtrSize(pAig->vCis), i_1 < iVar3; i_1 = i_1 + 1) {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,i_1);
      if (i_1 < nPars) {
        piVar1 = p->pVarNums;
        iVar3 = Aig_ObjId(pObj_00);
        Vec_IntWriteEntry(pVVar6,piVar1[iVar3],1);
      }
    }
    p_00 = Vec_IntAlloc(nPars);
    iVar3 = Abc_NtkPiNum(pNtk);
    p_01 = Vec_IntAlloc(iVar3 - nPars);
    for (i_1 = 0; iVar3 = Vec_IntSize(pVVar6), i_1 < iVar3; i_1 = i_1 + 1) {
      iVar3 = Vec_IntEntry(pVVar6,i_1);
      if (iVar3 == 0) {
        Vec_IntPush(p_01,i_1);
      }
      else {
        Vec_IntPush(p_00,i_1);
      }
    }
    pFileName_00 = Extra_FileNameGenericAppend(pNtk->pSpec,".qdimacs");
    Cnf_DataWriteIntoFile(p,pFileName_00,0,p_00,p_01);
    Aig_ManStop(pAig);
    Cnf_DataFree(p);
    Vec_IntFree(p_00);
    Vec_IntFree(p_01);
    Vec_IntFree(pVVar6);
    printf("The 2QBF formula was written into file \"%s\".\n",pFileName_00);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


/*
   Implementation of a simple QBF solver along the lines of
   A. Solar-Lezama, L. Tancau, R. Bodik, V. Saraswat, and S. Seshia, 
   "Combinatorial sketching for finite programs", 12th International 
   Conference on Architectural Support for Programming Languages and 
   Operating Systems (ASPLOS 2006), San Jose, CA, October 2006.
*/

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// static void Abc_NtkModelToVector( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues );
// static void Abc_NtkVectorClearPars( Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorClearVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorPrintPars( Vec_Int_t * vPiValues, int nPars );
// static void Abc_NtkVectorPrintVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars );

// extern int Abc_NtkDSat( Abc_Ntk_t * pNtk, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fAlignPol, int fAndOuts, int fNewSolver, int fVerbose );

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Solve the QBF problem EpAx[M(p,x)].]

  Description [Variables p go first, followed by variable x.
  The number of parameters is nPars. The miter is in pNtk.
  The miter expresses EQUALITY of the implementation and spec.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nItersMax, int fDumpCnf, int fVerbose )
{
    Abc_Ntk_t * pNtkVer, * pNtkSyn, * pNtkSyn2, * pNtkTemp;
    Vec_Int_t * vPiValues;
    abctime clkTotal = Abc_Clock(), clkS, clkV;
    int nIters, nInputs, RetValue, fFound = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( nPars > 0 && nPars < Abc_NtkPiNum(pNtk) );
//    assert( Abc_NtkPiNum(pNtk)-nPars < 32 );
    nInputs = Abc_NtkPiNum(pNtk) - nPars;

    if ( fDumpCnf )
    {
        // original problem: \exists p \forall x \exists y.  M(p,x,y)
        // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pMan = Abc_NtkToDar( pNtk, 0, 0 );
        Cnf_Dat_t * pCnf = Cnf_Derive( pMan, 0 );
        Vec_Int_t * vVarMap, * vForAlls, * vExists;
        Aig_Obj_t * pObj;
        char * pFileName;
        int i, Entry;
        // create var map
        vVarMap = Vec_IntStart( pCnf->nVars );
        Aig_ManForEachCi( pMan, pObj, i )
            if ( i < nPars )
                Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        // create various maps
        vForAlls = Vec_IntAlloc( nPars );
        vExists = Vec_IntAlloc( Abc_NtkPiNum(pNtk) - nPars );
        Vec_IntForEachEntry( vVarMap, Entry, i )
            if ( Entry )
                Vec_IntPush( vForAlls, i );
            else
                Vec_IntPush( vExists, i );
        // generate CNF
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".qdimacs" );
        Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
        Aig_ManStop( pMan );
        Cnf_DataFree( pCnf );
        Vec_IntFree( vForAlls );
        Vec_IntFree( vExists );
        Vec_IntFree( vVarMap );
        printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
        return;
    }

    // initialize the synthesized network with 0000-combination
    vPiValues = Vec_IntStart( Abc_NtkPiNum(pNtk) );

    // create random init value
    {
    int i;
    srand( time(NULL) );
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, rand() & 1 );
    }

    Abc_NtkVectorClearPars( vPiValues, nPars );
    pNtkSyn = Abc_NtkMiterCofactor( pNtk, vPiValues );
    if ( fVerbose )
    {
        printf( "Iter %2d : ", 0 );
        printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
        Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
        printf( "\n" );
    }

    // iteratively solve
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        // solve the synthesis instance
clkS = Abc_Clock();
//        RetValue = Abc_NtkMiterSat( pNtkSyn, 0, 0, 0, NULL, NULL );
        RetValue = Abc_NtkDSat( pNtkSyn, (ABC_INT64_T)0, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
clkS = Abc_Clock() - clkS;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkSyn, vPiValues );
        if ( RetValue == 1 )
        {
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Synthesis timed out.\n" );
            break;
        }
        // there is a counter-example

        // construct the verification instance
        Abc_NtkVectorClearVars( pNtk, vPiValues, nPars );
        pNtkVer = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // complement the output
        Abc_ObjXorFaninC( Abc_NtkPo(pNtkVer,0), 0 );

        // solve the verification instance
clkV = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtkVer, 0, 0, 0, NULL, NULL );
clkV = Abc_Clock() - clkV;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkVer, vPiValues );
        Abc_NtkDelete( pNtkVer );
        if ( RetValue == 1 )
        {
            fFound = 1;
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Verification timed out.\n" );
            break;
        }
        // there is a counter-example

        // create a new synthesis network
        Abc_NtkVectorClearPars( vPiValues, nPars );
        pNtkSyn2 = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // add to the synthesis instance
        pNtkSyn = Abc_NtkMiterAnd( pNtkTemp = pNtkSyn, pNtkSyn2, 0, 0 );
        Abc_NtkDelete( pNtkSyn2 );
        Abc_NtkDelete( pNtkTemp );

        if ( fVerbose )
        {
            printf( "Iter %2d : ", nIters+1 );
            printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
            Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
            printf( "  " );
            ABC_PRT( "Syn", clkS );
//            ABC_PRT( "Ver", clkV );
        }
        if ( nIters+1 == nItersMax )
            break;
    }
    Abc_NtkDelete( pNtkSyn );
    // report the results
    if ( fFound )
    {
        int nZeros = Vec_IntCountZero( vPiValues );
        printf( "Parameters: " );
        Abc_NtkVectorPrintPars( vPiValues, nPars );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(vPiValues) - nZeros );
        printf( "Solved after %d interations.  ", nIters );
    }
    else if ( nIters == nItersMax )
        printf( "Unsolved after %d interations.  ", nIters );
    else if ( nIters == nItersMax )
        printf( "Quit after %d interatios.  ", nItersMax );
    else
        printf( "Implementation does not exist.  " );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    Vec_IntFree( vPiValues );
}